

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

Result<vkb::Swapchain> * __thiscall
vkb::SwapchainBuilder::build(Result<vkb::Swapchain> *__return_storage_ptr__,SwapchainBuilder *this)

{
  uint uVar1;
  VkBaseOutStructure *pVVar2;
  VkResult VVar3;
  uint uVar4;
  VkPresentModeKHR VVar5;
  VkSurfaceTransformFlagBitsKHR VVar6;
  uint32_t uVar7;
  SurfaceSupportDetails *pSVar8;
  VkSurfaceFormatKHR VVar9;
  pointer ppVVar10;
  code *pcVar11;
  vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *pvVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  undefined8 *puVar16;
  SwapchainBuilder *pSVar17;
  Result<vkb::Swapchain> *pRVar18;
  VkExtent2D VVar19;
  uint uVar20;
  VkColorSpaceKHR VVar21;
  bool bVar22;
  byte bVar23;
  VkFormat VVar24;
  VkPhysicalDevice in_stack_fffffffffffffdb8;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> desired_present_modes;
  pointer local_218;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> desired_formats;
  undefined1 local_1f8 [20];
  VkFormat VStack_1e4;
  undefined8 uStack_1e0;
  VkExtent2D local_1d8;
  undefined8 uStack_1d0;
  pointer local_1c8;
  VkAllocationCallbacks *local_1c0;
  PFN_vkGetSwapchainImagesKHR p_Stack_1b8;
  PFN_vkCreateImageView local_1b0;
  PFN_vkDestroyImageView p_Stack_1a8;
  PFN_vkDestroySwapchainKHR local_1a0;
  undefined1 local_198 [24];
  VkSurfaceKHR pVStack_180;
  undefined8 local_178;
  VkColorSpaceKHR VStack_170;
  uint32_t uStack_16c;
  uint32_t uStack_168;
  uint32_t uStack_164;
  ulong uStack_160;
  undefined8 local_158;
  pointer *pppVStack_150;
  undefined8 local_148;
  ulong uStack_140;
  VkSwapchainKHR local_138;
  SurfaceSupportDetails surface_support;
  Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> images;
  Result<vkb::detail::SurfaceSupportDetails> surface_support_ret;
  
  bVar23 = 0;
  if ((this->info).surface == (VkSurfaceKHR)0x0) {
    (__return_storage_ptr__->field_0).m_error.type._M_value = 0;
    (__return_storage_ptr__->field_0).m_value.swapchain =
         (VkSwapchainKHR)&detail::swapchain_error_category;
    (__return_storage_ptr__->field_0).m_value.image_count = 0;
    __return_storage_ptr__->m_init = false;
    return __return_storage_ptr__;
  }
  pSVar17 = (SwapchainBuilder *)&desired_formats;
  std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::vector
            ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)pSVar17,
             &(this->info).desired_formats);
  if (desired_formats.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      desired_formats.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    add_desired_formats(pSVar17,&desired_formats);
  }
  pSVar17 = (SwapchainBuilder *)&desired_present_modes;
  std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::vector
            ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)pSVar17,
             &(this->info).desired_present_modes);
  if (desired_present_modes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      desired_present_modes.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    add_desired_present_modes(pSVar17,&desired_present_modes);
  }
  detail::query_surface_support_details(in_stack_fffffffffffffdb8,(VkSurfaceKHR)0x1072a1);
  if (surface_support_ret.m_init == false) {
    VVar3 = Result<vkb::detail::SurfaceSupportDetails>::vk_result(&surface_support_ret);
    (__return_storage_ptr__->field_0).m_error.type._M_value = 1;
    (__return_storage_ptr__->field_0).m_value.swapchain =
         (VkSwapchainKHR)&detail::swapchain_error_category;
    (__return_storage_ptr__->field_0).m_error.vk_result = VVar3;
    __return_storage_ptr__->m_init = false;
    goto LAB_001076f8;
  }
  pSVar8 = Result<vkb::detail::SurfaceSupportDetails>::value(&surface_support_ret);
  detail::SurfaceSupportDetails::SurfaceSupportDetails(&surface_support,pSVar8);
  uVar4 = (this->info).required_min_image_count;
  if (uVar4 == 0) {
    uVar14 = (this->info).min_image_count;
    if (uVar14 == 0) {
      uVar4 = surface_support.capabilities.minImageCount + 1;
    }
    else {
      uVar4 = surface_support.capabilities.minImageCount;
      if (surface_support.capabilities.minImageCount < uVar14) {
        uVar4 = uVar14;
      }
    }
LAB_00107341:
    uVar14 = surface_support.capabilities.maxImageCount;
    if (uVar4 < surface_support.capabilities.maxImageCount) {
      uVar14 = uVar4;
    }
    if (surface_support.capabilities.maxImageCount == 0) {
      uVar14 = uVar4;
    }
    VVar9 = detail::find_best_surface_format(&surface_support.formats,&desired_formats);
    uVar4 = surface_support.capabilities.currentExtent.width;
    uVar20 = surface_support.capabilities.currentExtent.height;
    if (surface_support.capabilities.currentExtent.width == 0xffffffff) {
      uVar4 = (this->info).desired_width;
      uVar20 = (this->info).desired_height;
      if (surface_support.capabilities.maxImageExtent.width < uVar4) {
        uVar4 = surface_support.capabilities.maxImageExtent.width;
      }
      if (uVar4 < surface_support.capabilities.minImageExtent.width) {
        uVar4 = surface_support.capabilities.minImageExtent.width;
      }
      if (surface_support.capabilities.maxImageExtent.height < uVar20) {
        uVar20 = surface_support.capabilities.maxImageExtent.height;
      }
      if (uVar20 < surface_support.capabilities.minImageExtent.height) {
        uVar20 = surface_support.capabilities.minImageExtent.height;
      }
    }
    uVar1 = (this->info).array_layer_count;
    uVar15 = surface_support.capabilities.maxImageArrayLayers;
    if (uVar1 <= surface_support.capabilities.maxImageArrayLayers) {
      uVar15 = uVar1;
    }
    if (uVar1 == 0) {
      uVar15 = 1;
    }
    local_218 = *(pointer *)&(this->info).graphics_queue_index;
    VVar5 = detail::find_present_mode(&surface_support.present_modes,&desired_present_modes);
    if ((VVar5 < 4) &&
       (((this->info).image_usage_flags & ~surface_support.capabilities.supportedUsageFlags) != 0))
    {
      (__return_storage_ptr__->field_0).m_error.type._M_value = 6;
      goto LAB_001076d8;
    }
    VVar6 = (this->info).pre_transform;
    if (VVar6 == 0) {
      VVar6 = surface_support.capabilities.currentTransform;
    }
    local_198._8_8_ = (VkSwapchainKHR)0x0;
    local_148._0_4_ = 0;
    local_148._4_4_ = 0;
    uStack_140._0_4_ = VK_PRESENT_MODE_IMMEDIATE_KHR;
    uStack_140._4_4_ = 0;
    local_158._0_4_ = 0;
    local_158._4_4_ = 0;
    pppVStack_150 = (pointer *)0x0;
    uStack_168 = 0;
    uStack_164 = 0;
    uStack_160._0_4_ = 0;
    uStack_160._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
    local_138 = (VkSwapchainKHR)0x0;
    local_178._0_4_ = 0;
    local_178._4_4_ = VK_FORMAT_UNDEFINED;
    VStack_170 = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
    uStack_16c = 0;
    local_198._16_8_ = (VkAllocationCallbacks *)0x0;
    pVStack_180 = (VkSurfaceKHR)0x0;
    local_198._0_8_ = 0x3b9acde8;
    detail::setup_pNext_chain<VkSwapchainCreateInfoKHR>
              ((VkSwapchainCreateInfoKHR *)local_198,&(this->info).pNext_chain);
    VVar19.height = uVar20;
    VVar19.width = uVar4;
    ppVVar10 = (this->info).pNext_chain.
               super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    while (ppVVar10 !=
           (this->info).pNext_chain.
           super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
           super__Vector_impl_data._M_finish) {
      pVVar2 = *ppVVar10;
      ppVVar10 = ppVVar10 + 1;
      if (pVVar2->sType == VK_STRUCTURE_TYPE_APPLICATION_INFO) {
        __assert_fail("node->sType != VK_STRUCTURE_TYPE_APPLICATION_INFO",
                      "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                      ,0x7b1,"Result<Swapchain> vkb::SwapchainBuilder::build() const");
      }
    }
    local_198._16_4_ = (this->info).create_flags;
    pVStack_180 = (this->info).surface;
    local_178._4_4_ = VVar9.format;
    local_178._0_4_ = uVar14;
    VVar21 = VVar9.colorSpace;
    bVar22 = (this->info).graphics_queue_index != (this->info).present_queue_index;
    if (bVar22) {
      local_158._0_4_ = 2;
      pppVStack_150 = &local_218;
    }
    uStack_160 = (ulong)CONCAT14(bVar22,(this->info).image_usage_flags);
    local_148._4_4_ = (this->info).composite_alpha;
    local_148._0_4_ = VVar6;
    uStack_140 = (ulong)CONCAT14((this->info).clipped,VVar5);
    local_138 = (this->info).old_swapchain;
    local_1d8.width = 0;
    local_1d8.height = 0;
    uStack_1d0 = (pointer)0x0;
    stack0xfffffffffffffe18 = (pointer)0x0;
    uStack_1e0 = (VkSurfaceKHR)0x0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    local_1c8 = (pointer)0x400000;
    local_1c0 = (VkAllocationCallbacks *)0x0;
    p_Stack_1b8 = (PFN_vkGetSwapchainImagesKHR)0x0;
    local_1b0 = (PFN_vkCreateImageView)0x0;
    p_Stack_1a8 = (PFN_vkDestroyImageView)0x0;
    local_1a0 = (PFN_vkDestroySwapchainKHR)0x0;
    VStack_170 = VVar21;
    uStack_16c = uVar4;
    uStack_168 = uVar20;
    uStack_164 = uVar15;
    pcVar11 = (code *)(*(code *)detail::vulkan_functions()::v._192_8_)
                                ((this->info).device,"vkCreateSwapchainKHR");
    VVar24 = VVar9.format;
    uVar7 = (*pcVar11)((this->info).device,local_198,(this->info).allocation_callbacks,local_1f8 + 8
                      );
    if (uVar7 != 0) {
      (__return_storage_ptr__->field_0).m_error.type._M_value = 2;
      (__return_storage_ptr__->field_0).m_value.swapchain =
           (VkSwapchainKHR)&detail::swapchain_error_category;
      (__return_storage_ptr__->field_0).m_value.image_count = uVar7;
      goto LAB_001076e7;
    }
    local_1f8._0_8_ = (this->info).device;
    stack0xfffffffffffffe18 = (pointer)CONCAT44(VVar24,local_1f8._16_4_);
    uStack_1e0 = (VkSurfaceKHR)CONCAT44((this->info).image_usage_flags,VVar21);
    local_1d8 = VVar19;
    p_Stack_1b8 = (PFN_vkGetSwapchainImagesKHR)
                  (*(code *)detail::vulkan_functions()::v._192_8_)
                            (local_1f8._0_8_,"vkGetSwapchainImagesKHR");
    local_1b0 = (PFN_vkCreateImageView)
                (*(code *)detail::vulkan_functions()::v._192_8_)
                          ((this->info).device,"vkCreateImageView");
    p_Stack_1a8 = (PFN_vkDestroyImageView)
                  (*(code *)detail::vulkan_functions()::v._192_8_)
                            ((this->info).device,"vkDestroyImageView");
    local_1a0 = (PFN_vkDestroySwapchainKHR)
                (*(code *)detail::vulkan_functions()::v._192_8_)
                          ((this->info).device,"vkDestroySwapchainKHR");
    Swapchain::get_images(&images,(Swapchain *)local_1f8);
    if (images.m_init == false) {
      (__return_storage_ptr__->field_0).m_error.type._M_value = 3;
      (__return_storage_ptr__->field_0).m_value.swapchain =
           (VkSwapchainKHR)&detail::swapchain_error_category;
      (__return_storage_ptr__->field_0).m_value.image_count = 0;
      bVar22 = false;
    }
    else {
      uStack_1d0 = (pointer)CONCAT44(VVar5,uVar14);
      pvVar12 = Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_>::value(&images);
      stack0xfffffffffffffe18 =
           (pointer)CONCAT44(VStack_1e4,
                             (VkSwapchainCreateFlagBitsKHR)
                             ((ulong)((long)(pvVar12->
                                            super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pvVar12->
                                           super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start) >> 3));
      local_1c8 = (pointer)CONCAT44(local_1c8._4_4_,(this->info).instance_version);
      local_1c0 = (this->info).allocation_callbacks;
      puVar16 = (undefined8 *)local_1f8;
      pRVar18 = __return_storage_ptr__;
      for (lVar13 = 0xc; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pRVar18->field_0).m_value.device = (VkDevice)*puVar16;
        puVar16 = puVar16 + (ulong)bVar23 * -2 + 1;
        pRVar18 = (Result<vkb::Swapchain> *)((long)pRVar18 + (ulong)bVar23 * -0x10 + 8);
      }
      bVar22 = true;
    }
    __return_storage_ptr__->m_init = bVar22;
    Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_>::destroy(&images);
  }
  else {
    if (surface_support.capabilities.minImageCount <= uVar4) goto LAB_00107341;
    (__return_storage_ptr__->field_0).m_error.type._M_value = 5;
LAB_001076d8:
    (__return_storage_ptr__->field_0).m_value.swapchain =
         (VkSwapchainKHR)&detail::swapchain_error_category;
    (__return_storage_ptr__->field_0).m_value.image_count = 0;
LAB_001076e7:
    __return_storage_ptr__->m_init = false;
  }
  detail::SurfaceSupportDetails::~SurfaceSupportDetails(&surface_support);
LAB_001076f8:
  Result<vkb::detail::SurfaceSupportDetails>::destroy(&surface_support_ret);
  std::_Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::~_Vector_base
            (&desired_present_modes.
              super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>);
  std::_Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::~_Vector_base
            (&desired_formats.
              super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>);
  return __return_storage_ptr__;
}

Assistant:

Result<Swapchain> SwapchainBuilder::build() const {
    if (info.surface == VK_NULL_HANDLE) {
        return Error{ SwapchainError::surface_handle_not_provided };
    }

    auto desired_formats = info.desired_formats;
    if (desired_formats.size() == 0) add_desired_formats(desired_formats);
    auto desired_present_modes = info.desired_present_modes;
    if (desired_present_modes.size() == 0) add_desired_present_modes(desired_present_modes);

    auto surface_support_ret = detail::query_surface_support_details(info.physical_device, info.surface);
    if (!surface_support_ret.has_value())
        return Error{ SwapchainError::failed_query_surface_support_details, surface_support_ret.vk_result() };
    auto surface_support = surface_support_ret.value();

    uint32_t image_count = info.min_image_count;
    if (info.required_min_image_count >= 1) {
        if (info.required_min_image_count < surface_support.capabilities.minImageCount)
            return make_error_code(SwapchainError::required_min_image_count_too_low);

        image_count = info.required_min_image_count;
    } else if (info.min_image_count == 0) {
        // We intentionally use minImageCount + 1 to maintain existing behavior, even if it typically results in triple buffering on most systems.
        image_count = surface_support.capabilities.minImageCount + 1;
    } else {
        image_count = info.min_image_count;
        if (image_count < surface_support.capabilities.minImageCount)
            image_count = surface_support.capabilities.minImageCount;
    }
    if (surface_support.capabilities.maxImageCount > 0 && image_count > surface_support.capabilities.maxImageCount) {
        image_count = surface_support.capabilities.maxImageCount;
    }

    VkSurfaceFormatKHR surface_format = detail::find_best_surface_format(surface_support.formats, desired_formats);

    VkExtent2D extent = detail::find_extent(surface_support.capabilities, info.desired_width, info.desired_height);

    uint32_t image_array_layers = info.array_layer_count;
    if (surface_support.capabilities.maxImageArrayLayers < info.array_layer_count)
        image_array_layers = surface_support.capabilities.maxImageArrayLayers;
    if (info.array_layer_count == 0) image_array_layers = 1;

    uint32_t queue_family_indices[] = { info.graphics_queue_index, info.present_queue_index };


    VkPresentModeKHR present_mode = detail::find_present_mode(surface_support.present_modes, desired_present_modes);

    // VkSurfaceCapabilitiesKHR::supportedUsageFlags is only only valid for some present modes. For shared present modes, we should also check VkSharedPresentSurfaceCapabilitiesKHR::sharedPresentSupportedUsageFlags.
    auto is_unextended_present_mode = [](VkPresentModeKHR present_mode) {
        return (present_mode == VK_PRESENT_MODE_IMMEDIATE_KHR) || (present_mode == VK_PRESENT_MODE_MAILBOX_KHR) ||
               (present_mode == VK_PRESENT_MODE_FIFO_KHR) || (present_mode == VK_PRESENT_MODE_FIFO_RELAXED_KHR);
    };

    if (is_unextended_present_mode(present_mode) &&
        (info.image_usage_flags & surface_support.capabilities.supportedUsageFlags) != info.image_usage_flags) {
        return Error{ SwapchainError::required_usage_not_supported };
    }

    VkSurfaceTransformFlagBitsKHR pre_transform = info.pre_transform;
    if (info.pre_transform == static_cast<VkSurfaceTransformFlagBitsKHR>(0))
        pre_transform = surface_support.capabilities.currentTransform;

    VkSwapchainCreateInfoKHR swapchain_create_info = {};
    swapchain_create_info.sType = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
    detail::setup_pNext_chain(swapchain_create_info, info.pNext_chain);
#if !defined(NDEBUG)
    for (auto& node : info.pNext_chain) {
        assert(node->sType != VK_STRUCTURE_TYPE_APPLICATION_INFO);
    }
#endif
    swapchain_create_info.flags = info.create_flags;
    swapchain_create_info.surface = info.surface;
    swapchain_create_info.minImageCount = image_count;
    swapchain_create_info.imageFormat = surface_format.format;
    swapchain_create_info.imageColorSpace = surface_format.colorSpace;
    swapchain_create_info.imageExtent = extent;
    swapchain_create_info.imageArrayLayers = image_array_layers;
    swapchain_create_info.imageUsage = info.image_usage_flags;

    if (info.graphics_queue_index != info.present_queue_index) {
        swapchain_create_info.imageSharingMode = VK_SHARING_MODE_CONCURRENT;
        swapchain_create_info.queueFamilyIndexCount = 2;
        swapchain_create_info.pQueueFamilyIndices = queue_family_indices;
    } else {
        swapchain_create_info.imageSharingMode = VK_SHARING_MODE_EXCLUSIVE;
    }

    swapchain_create_info.preTransform = pre_transform;
    swapchain_create_info.compositeAlpha = info.composite_alpha;
    swapchain_create_info.presentMode = present_mode;
    swapchain_create_info.clipped = info.clipped;
    swapchain_create_info.oldSwapchain = info.old_swapchain;
    Swapchain swapchain{};
    PFN_vkCreateSwapchainKHR swapchain_create_proc;
    detail::vulkan_functions().get_device_proc_addr(info.device, swapchain_create_proc, "vkCreateSwapchainKHR");
    auto res = swapchain_create_proc(info.device, &swapchain_create_info, info.allocation_callbacks, &swapchain.swapchain);

    if (res != VK_SUCCESS) {
        return Error{ SwapchainError::failed_create_swapchain, res };
    }
    swapchain.device = info.device;
    swapchain.image_format = surface_format.format;
    swapchain.color_space = surface_format.colorSpace;
    swapchain.image_usage_flags = info.image_usage_flags;
    swapchain.extent = extent;
    detail::vulkan_functions().get_device_proc_addr(
        info.device, swapchain.internal_table.fp_vkGetSwapchainImagesKHR, "vkGetSwapchainImagesKHR");
    detail::vulkan_functions().get_device_proc_addr(info.device, swapchain.internal_table.fp_vkCreateImageView, "vkCreateImageView");
    detail::vulkan_functions().get_device_proc_addr(info.device, swapchain.internal_table.fp_vkDestroyImageView, "vkDestroyImageView");
    detail::vulkan_functions().get_device_proc_addr(
        info.device, swapchain.internal_table.fp_vkDestroySwapchainKHR, "vkDestroySwapchainKHR");
    auto images = swapchain.get_images();
    if (!images) {
        return Error{ SwapchainError::failed_get_swapchain_images };
    }
    swapchain.requested_min_image_count = image_count;
    swapchain.present_mode = present_mode;
    swapchain.image_count = static_cast<uint32_t>(images.value().size());
    swapchain.instance_version = info.instance_version;
    swapchain.allocation_callbacks = info.allocation_callbacks;
    return swapchain;
}